

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader-test.cc
# Opt level: O3

void __thiscall
NLStringRefTest_ConstructFromCStringAndSize_Test::TestBody
          (NLStringRefTest_ConstructFromCStringAndSize_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar;
  NLStringRef s;
  char *data;
  AssertHelper local_80;
  AssertionResult local_78;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_60;
  long local_58 [2];
  NLStringRef local_48;
  char *local_38;
  NLStringRef local_30;
  
  local_38 = "foo";
  mp::NLStringRef::NLStringRef(&local_48,"foo",7);
  local_78._0_8_ = local_48.data_;
  testing::internal::CmpHelperEQ<char_const*,char_const*>
            ((internal *)&local_68,"data","s.c_str()",&local_38,(char **)&local_78);
  if (local_68.ptr_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_78);
    if (local_60.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_60.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc",
               0x53,pcVar2);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    if ((((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
        (bVar1 = testing::internal::IsTrue(true), bVar1)) &&
       ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(long *)local_78._0_8_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_60,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_80.data_._0_4_ = 7;
  local_78._0_8_ = local_48.size_;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)&local_68,"7u","s.size()",(uint *)&local_80,(unsigned_long *)&local_78);
  if (local_68.ptr_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_78);
    if (local_60.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_60.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc",
               0x54,pcVar2);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    if ((((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
        (bVar1 = testing::internal::IsTrue(true), bVar1)) &&
       ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(long *)local_78._0_8_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_60,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  testing::AssertionSuccess();
  if (local_78.success_ == true) {
    local_68.ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_68,"string not null-terminated","");
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      mp::NLStringRef::NLStringRef(&local_30,"foo",2);
    }
    testing::AssertionResult::operator<<
              (&local_78,
               (char (*) [111])
               "Expected: mp::NLStringRef(\"foo\", 2) throws an exception of type AssertionFailure.\n  Actual: it throws nothing."
              );
    if (local_68.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58) {
      operator_delete(local_68.ptr_,local_58[0] + 1);
    }
  }
  testing::Message::Message((Message *)&local_68);
  if (local_78.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar2 = "";
  }
  else {
    pcVar2 = ((local_78.message_.ptr_)->_M_dataplus)._M_p;
  }
  testing::internal::AssertHelper::AssertHelper
            (&local_80,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc",
             0x55,pcVar2);
  testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_68);
  testing::internal::AssertHelper::~AssertHelper(&local_80);
  if (((local_68.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
      (bVar1 = testing::internal::IsTrue(true), bVar1)) &&
     (local_68.ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
    (**(code **)(*(long *)local_68.ptr_ + 8))();
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_78.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  return;
}

Assistant:

TEST(NLStringRefTest, ConstructFromCStringAndSize) {
  const char *data = "foo\0bar";
  const mp::NLStringRef s(data, 7);
  EXPECT_EQ(data, s.c_str());
  EXPECT_EQ(7u, s.size());
  EXPECT_ASSERT(mp::NLStringRef("foo", 2), "string not null-terminated");
}